

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O3

int Abc_NtkFraigSweep(Abc_Ntk_t *pNtk,int fUseInv,int fExdc,int fVerbose,int fVeryVerbose)

{
  void **ppvVar1;
  ulong uVar2;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int iVar6;
  long lVar7;
  Abc_Ntk_t *pAVar8;
  void *pvVar9;
  Fraig_Node_t *pFVar10;
  Fraig_Node_t *pFVar11;
  Vec_Ptr_t *pVVar12;
  Abc_Obj_t *pAVar13;
  stmm_generator *gen;
  Abc_Obj_t *pAVar14;
  Abc_Obj_t *pAVar15;
  long lVar16;
  stmm_table *table;
  Abc_Obj_t *pAVar17;
  Abc_Obj_t *pAVar18;
  Abc_Obj_t *pAVar19;
  ulong uVar20;
  char *pcVar21;
  uint uVar22;
  stmm_table *table_00;
  bool bVar23;
  float fVar24;
  Abc_Obj_t *pList;
  Abc_Obj_t **ppSlot;
  Fraig_Node_t *gNode;
  Fraig_Params_t Params;
  Abc_Obj_t *local_b8;
  stmm_generator *local_b0;
  stmm_table *local_a8;
  int local_a0;
  uint local_9c;
  stmm_table *local_98;
  Fraig_Man_t *local_90;
  Abc_Ntk_t *local_88;
  char **local_80;
  char *local_78;
  Fraig_Params_t local_70;
  
  local_b0 = (stmm_generator *)CONCAT44(local_b0._4_4_,fVeryVerbose);
  local_a0 = fVerbose;
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    __assert_fail("!Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x47,"int Abc_NtkFraigSweep(Abc_Ntk_t *, int, int, int, int)");
  }
  if (pNtk->ntkType == ABC_NTK_LOGIC && pNtk->ntkFunc == ABC_FUNC_MAP) {
    lVar7 = (long)pNtk->vObjs->nSize;
    if (0 < lVar7) {
      ppvVar1 = pNtk->vObjs->pArray;
      lVar16 = 0;
      do {
        pvVar9 = ppvVar1[lVar16];
        if ((pvVar9 != (void *)0x0) && ((*(uint *)((long)pvVar9 + 0x14) & 0xf) == 7)) {
          *(undefined8 *)((long)pvVar9 + 8) = *(undefined8 *)((long)pvVar9 + 0x38);
        }
        lVar16 = lVar16 + 1;
      } while (lVar7 != lVar16);
    }
    pAVar8 = Abc_NtkStrash(pNtk,0,1,0);
    Hop_ManStop((Hop_Man_t *)pNtk->pManFunc);
    pvVar9 = Abc_FrameReadLibGen();
    pNtk->pManFunc = pvVar9;
    pNtk->ntkFunc = ABC_FUNC_MAP;
    pVVar12 = pNtk->vObjs;
    if (0 < pVVar12->nSize) {
      lVar7 = 0;
      do {
        pvVar9 = pVVar12->pArray[lVar7];
        if ((pvVar9 != (void *)0x0) && ((*(uint *)((long)pvVar9 + 0x14) & 0xf) == 7)) {
          *(undefined8 *)((long)pvVar9 + 0x38) = *(undefined8 *)((long)pvVar9 + 8);
          *(undefined8 *)((long)pvVar9 + 8) = 0;
          pVVar12 = pNtk->vObjs;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar12->nSize);
    }
  }
  else {
    pAVar8 = Abc_NtkStrash(pNtk,0,1,0);
  }
  Fraig_ParamsSetDefault(&local_70);
  local_70.fInternal = 1;
  local_88 = pAVar8;
  local_90 = (Fraig_Man_t *)Abc_NtkToFraig(pAVar8,&local_70,0,0);
  if (fExdc != 0) {
    if (pNtk->pExdc == (Abc_Ntk_t *)0x0) {
      puts("Warning: Networks has no EXDC.");
    }
    else {
      pFVar10 = Abc_NtkToFraigExdc(local_90,pNtk,pNtk->pExdc);
      pVVar12 = pNtk->vObjs;
      if (0 < pVVar12->nSize) {
        lVar7 = 0;
        do {
          pvVar9 = pVVar12->pArray[lVar7];
          if ((((pvVar9 != (void *)0x0) && ((*(uint *)((long)pvVar9 + 0x14) & 0xf) == 7)) &&
              (*(int *)((long)pvVar9 + 0x1c) != 0)) &&
             (uVar2 = *(ulong *)((long)pvVar9 + 0x40), uVar2 != 0)) {
            uVar20 = (ulong)((uint)uVar2 & 1);
            pFVar11 = Fraig_NodeAnd(local_90,(Fraig_Node_t *)
                                             (*(ulong *)((uVar2 & 0xfffffffffffffffe) + 0x40) ^
                                             uVar20),(Fraig_Node_t *)((ulong)pFVar10 ^ 1));
            *(ulong *)((uVar2 & 0xfffffffffffffffe) + 0x40) = (ulong)pFVar11 ^ uVar20;
            pVVar12 = pNtk->vObjs;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < pVVar12->nSize);
      }
    }
  }
  Abc_NtkLevel(pNtk);
  local_a8 = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
  pVVar12 = pNtk->vObjs;
  if (0 < pVVar12->nSize) {
    lVar7 = 0;
    do {
      pAVar15 = (Abc_Obj_t *)pVVar12->pArray[lVar7];
      if (((pAVar15 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar15->field_0x14 & 0xf) == 7)) &&
         (((pAVar15->vFanins).nSize != 0 &&
          ((aVar3 = pAVar15->field_6, aVar3.pTemp != (void *)0x0 &&
           (pAVar13 = Abc_NodeFindCoFanout(pAVar15), pAVar13 == (Abc_Obj_t *)0x0)))))) {
        uVar2 = *(ulong *)(((ulong)aVar3.pTemp & 0xfffffffffffffffe) + 0x40);
        pcVar21 = (char *)(aVar3.iTemp & 1 ^ uVar2);
        local_78 = pcVar21;
        iVar6 = stmm_find_or_add(local_a8,(char *)(uVar2 & 0xfffffffffffffffe),&local_80);
        if (iVar6 == 0) {
          *local_80 = (char *)0x0;
        }
        pAVar15->pNext = (Abc_Obj_t *)*local_80;
        *local_80 = (char *)pAVar15;
        *(uint *)&pAVar15->field_0x14 =
             *(uint *)&pAVar15->field_0x14 & 0xffffff7f | ((uint)pcVar21 & 1) << 7;
      }
      lVar7 = lVar7 + 1;
      pVVar12 = pNtk->vObjs;
    } while (lVar7 < pVVar12->nSize);
  }
  local_98 = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
  table = local_a8;
  gen = stmm_init_gen(local_a8);
  iVar6 = stmm_gen(gen,&local_78,(char **)&local_b8);
  if (iVar6 == 0) {
    uVar22 = 0;
  }
  else {
    uVar22 = 0;
    local_9c = 0;
    do {
      if ((local_b8 != (Abc_Obj_t *)0x0) && (local_b8->pNext != (Abc_Obj_t *)0x0)) {
        stmm_insert(local_98,(char *)local_b8,(char *)0x0);
        for (pAVar15 = local_b8; pAVar15 != (Abc_Obj_t *)0x0; pAVar15 = pAVar15->pNext) {
          uVar22 = uVar22 + 1;
        }
        if ((int)local_b0 != 0) {
          printf("Class %2d : {",(ulong)local_9c);
          for (pAVar15 = local_b8; pAVar15 != (Abc_Obj_t *)0x0; pAVar15 = pAVar15->pNext) {
            (pAVar15->field_6).pTemp = (void *)0x0;
            pcVar21 = Abc_ObjName(pAVar15);
            printf(" %s",pcVar21);
            printf("(%c)",(ulong)((uint)((byte)pAVar15->field_0x14 >> 7) * 2 + 0x2b));
            printf("(%d)",(ulong)(*(uint *)&pAVar15->field_0x14 >> 0xc));
          }
          puts(" }");
          local_9c = local_9c + 1;
          table = local_a8;
        }
      }
      iVar6 = stmm_gen(gen,&local_78,(char **)&local_b8);
    } while (iVar6 != 0);
  }
  stmm_free_gen(gen);
  table_00 = local_98;
  if ((int)local_b0 != 0 || local_a0 != 0) {
    printf("Sweeping stats for network \"%s\":\n",pNtk->pName);
    printf("Internal nodes = %d. Different functions (up to compl) = %d.\n",
           (ulong)(uint)pNtk->nObjCounts[7],(ulong)(uint)table->num_entries);
    printf("Non-trivial classes = %d. Nodes in non-trivial classes = %d.\n",
           (ulong)(uint)table_00->num_entries,(ulong)uVar22);
  }
  stmm_free_table(table);
  pAVar8 = local_88;
  if (table_00->num_entries != 0) {
    if (pNtk->ntkFunc == ABC_FUNC_MAP) {
      Abc_NtkDelayTrace(pNtk,(Abc_Obj_t *)0x0,(Abc_Obj_t *)0x0,0);
      local_b0 = stmm_init_gen(table_00);
      iVar6 = stmm_gen(local_b0,(char **)&local_b8,(char **)0x0);
      while (iVar6 != 0) {
        if (local_b8 == (Abc_Obj_t *)0x0) {
          __assert_fail("pChain",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                        ,0x13b,
                        "void Abc_NtkFraigMergeClassMapped(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
        }
        pAVar15 = local_b8->pNext;
        if (pAVar15 == (Abc_Obj_t *)0x0) {
          __assert_fail("pChain->pNext",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                        ,0x13c,
                        "void Abc_NtkFraigMergeClassMapped(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
        }
        bVar23 = -1 < (char)local_b8->field_0x14;
        pAVar13 = local_b8;
        if (bVar23) {
          pAVar13 = (Abc_Obj_t *)0x0;
        }
        pAVar17 = (Abc_Obj_t *)0x0;
        if (bVar23) {
          pAVar17 = local_b8;
        }
        local_b8->pNext = (Abc_Obj_t *)0x0;
        do {
          pAVar14 = pAVar17;
          pAVar19 = pAVar15;
          pAVar18 = pAVar13;
          if (-1 < (char)pAVar15->field_0x14) {
            pAVar14 = pAVar15;
            pAVar19 = pAVar13;
            pAVar18 = pAVar17;
          }
          pAVar13 = pAVar19;
          pAVar19 = pAVar15->pNext;
          pAVar15->pNext = pAVar18;
          pAVar15 = pAVar19;
          pAVar17 = pAVar14;
        } while (pAVar19 != (Abc_Obj_t *)0x0);
        pAVar17 = pAVar13;
        pAVar15 = pAVar13;
        if (pAVar13 != (Abc_Obj_t *)0x0) {
          do {
            fVar24 = Abc_NodeReadArrivalWorst(pAVar17);
            local_a8 = (stmm_table *)CONCAT44(local_a8._4_4_,fVar24);
            fVar24 = Abc_NodeReadArrivalWorst(pAVar15);
            pAVar18 = pAVar15;
            if ((local_a8._0_4_ <= fVar24) &&
               (((local_a8._0_4_ != fVar24 || (NAN(local_a8._0_4_) || NAN(fVar24))) ||
                (*(uint *)&pAVar17->field_0x14 >> 0xc <= *(uint *)&pAVar15->field_0x14 >> 0xc)))) {
              pAVar18 = pAVar17;
            }
            pAVar15 = pAVar15->pNext;
            pAVar17 = pAVar18;
          } while (pAVar15 != (Abc_Obj_t *)0x0);
          do {
            if (pAVar13 != pAVar18) {
              Abc_ObjTransferFanout(pAVar13,pAVar18);
            }
            pAVar13 = pAVar13->pNext;
          } while (pAVar13 != (Abc_Obj_t *)0x0);
        }
        pAVar13 = pAVar14;
        pAVar15 = pAVar14;
        if (pAVar14 != (Abc_Obj_t *)0x0) {
          do {
            fVar24 = Abc_NodeReadArrivalWorst(pAVar13);
            local_a8 = (stmm_table *)CONCAT44(local_a8._4_4_,fVar24);
            fVar24 = Abc_NodeReadArrivalWorst(pAVar15);
            pAVar17 = pAVar15;
            if ((local_a8._0_4_ <= fVar24) &&
               (((local_a8._0_4_ != fVar24 || (NAN(local_a8._0_4_) || NAN(fVar24))) ||
                (*(uint *)&pAVar13->field_0x14 >> 0xc <= *(uint *)&pAVar15->field_0x14 >> 0xc)))) {
              pAVar17 = pAVar13;
            }
            pAVar15 = pAVar15->pNext;
            pAVar13 = pAVar17;
          } while (pAVar15 != (Abc_Obj_t *)0x0);
          do {
            if (pAVar14 != pAVar17) {
              Abc_ObjTransferFanout(pAVar14,pAVar17);
            }
            pAVar14 = pAVar14->pNext;
          } while (pAVar14 != (Abc_Obj_t *)0x0);
        }
        iVar6 = stmm_gen(local_b0,(char **)&local_b8,(char **)0x0);
        pAVar8 = local_88;
      }
    }
    else {
      local_b0 = stmm_init_gen(table_00);
      iVar6 = stmm_gen(local_b0,(char **)&local_b8,(char **)0x0);
      while (iVar6 != 0) {
        if (local_b8 == (Abc_Obj_t *)0x0) {
          __assert_fail("pChain",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                        ,0x18d,"void Abc_NtkFraigMergeClass(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
        }
        pAVar15 = local_b8->pNext;
        pAVar13 = pAVar15;
        pAVar17 = local_b8;
        if (pAVar15 == (Abc_Obj_t *)0x0) {
          __assert_fail("pChain->pNext",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                        ,0x18e,"void Abc_NtkFraigMergeClass(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
        }
        do {
          pAVar14 = pAVar13;
          if (*(uint *)&pAVar17->field_0x14 >> 0xc <= *(uint *)&pAVar13->field_0x14 >> 0xc) {
            pAVar14 = pAVar17;
          }
          pAVar17 = pAVar14;
          pAVar13 = pAVar13->pNext;
        } while (pAVar13 != (Abc_Obj_t *)0x0);
        pAVar13 = (Abc_Obj_t *)0x0;
        pAVar14 = local_b8;
        pAVar18 = (Abc_Obj_t *)0x0;
        while( true ) {
          pAVar19 = pAVar18;
          if (pAVar14 != pAVar17) {
            pAVar5 = pAVar14;
            pAVar4 = pAVar13;
            if (-1 < (char)(pAVar14->field_0x14 ^ pAVar17->field_0x14)) {
              pAVar19 = pAVar14;
              pAVar5 = pAVar13;
              pAVar4 = pAVar18;
            }
            pAVar13 = pAVar5;
            pAVar14->pNext = pAVar4;
          }
          if (pAVar15 == (Abc_Obj_t *)0x0) break;
          pAVar14 = pAVar15;
          pAVar15 = pAVar15->pNext;
          pAVar18 = pAVar19;
        }
        for (; pAVar19 != (Abc_Obj_t *)0x0; pAVar19 = pAVar19->pNext) {
          Abc_ObjTransferFanout(pAVar19,pAVar17);
        }
        if (pAVar13 != (Abc_Obj_t *)0x0) {
          pAVar15 = Abc_NtkCreateNodeInv(pNtk,pAVar17);
          do {
            Abc_ObjTransferFanout(pAVar13,pAVar15);
            pAVar13 = pAVar13->pNext;
          } while (pAVar13 != (Abc_Obj_t *)0x0);
        }
        iVar6 = stmm_gen(local_b0,(char **)&local_b8,(char **)0x0);
        pAVar8 = local_88;
      }
    }
    stmm_free_gen(local_b0);
    table_00 = local_98;
  }
  stmm_free_table(table_00);
  Fraig_ManFree(local_90);
  Abc_NtkDelete(pAVar8);
  if (pNtk->ntkFunc == ABC_FUNC_MAP) {
    Abc_NtkCleanup(pNtk,local_a0);
  }
  else {
    Abc_NtkSweep(pNtk,local_a0);
  }
  iVar6 = Abc_NtkCheck(pNtk);
  if (iVar6 == 0) {
    puts("Abc_NtkFraigSweep: The network check has failed.");
  }
  return (uint)(iVar6 != 0);
}

Assistant:

int Abc_NtkFraigSweep( Abc_Ntk_t * pNtk, int fUseInv, int fExdc, int fVerbose, int fVeryVerbose )
{
    Fraig_Params_t Params;
    Abc_Ntk_t * pNtkAig;
    Fraig_Man_t * pMan;
    stmm_table * tEquiv;
    Abc_Obj_t * pObj;
    int i, fUseTrick;

    assert( !Abc_NtkIsStrash(pNtk) );

    // save gate assignments
    fUseTrick = 0;
    if ( Abc_NtkIsMappedLogic(pNtk) )
    {
        fUseTrick = 1;
        Abc_NtkForEachNode( pNtk, pObj, i )
            pObj->pNext = (Abc_Obj_t *)pObj->pData;
    }
    // derive the AIG
    pNtkAig = Abc_NtkStrash( pNtk, 0, 1, 0 );
    // reconstruct gate assignments
    if ( fUseTrick )
    {
//        extern void * Abc_FrameReadLibGen(); 
        Hop_ManStop( (Hop_Man_t *)pNtk->pManFunc );
        pNtk->pManFunc = Abc_FrameReadLibGen();
        pNtk->ntkFunc = ABC_FUNC_MAP;
        Abc_NtkForEachNode( pNtk, pObj, i )
            pObj->pData = pObj->pNext, pObj->pNext = NULL;
    }

    // perform fraiging of the AIG
    Fraig_ParamsSetDefault( &Params );
    Params.fInternal = 1;
    pMan = (Fraig_Man_t *)Abc_NtkToFraig( pNtkAig, &Params, 0, 0 );   
    // cannot use EXDC with FRAIG because it can create classes of equivalent FRAIG nodes
    // with representative nodes that do not correspond to the nodes with the current network

    // update FRAIG using EXDC
    if ( fExdc )
    {
        if ( pNtk->pExdc == NULL )
            printf( "Warning: Networks has no EXDC.\n" );
        else
            Abc_NtkFraigSweepUsingExdc( pMan, pNtk );
    }
    // assign levels to the nodes of the network
    Abc_NtkLevel( pNtk );

    // collect the classes of equivalent nets
    tEquiv = Abc_NtkFraigEquiv( pNtk, fUseInv, fVerbose, fVeryVerbose );

    // transform the network into the equivalent one
    Abc_NtkFraigTransform( pNtk, tEquiv, fUseInv, fVerbose );
    stmm_free_table( tEquiv );

    // free the manager
    Fraig_ManFree( pMan );
    Abc_NtkDelete( pNtkAig );

    // cleanup the dangling nodes
    if ( Abc_NtkHasMapping(pNtk) )
        Abc_NtkCleanup( pNtk, fVerbose );
    else
        Abc_NtkSweep( pNtk, fVerbose );

    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkFraigSweep: The network check has failed.\n" );
        return 0;
    }
    return 1;
}